

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O1

BoundLimitNode * __thiscall
duckdb::Binder::BindLimitValue
          (BoundLimitNode *__return_storage_ptr__,Binder *this,OrderBinder *order_binder,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *limit_val,bool is_percentage,bool is_offset)

{
  ClientContext *pCVar1;
  optional_idx error_location;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  type pBVar5;
  pointer pPVar6;
  pointer pEVar7;
  type expr_00;
  Binder *pBVar8;
  int64_t value;
  BinderException *pBVar9;
  OutOfRangeException *this_00;
  BoundLimitNode *__return_storage_ptr___00;
  undefined3 in_register_00000089;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  original_limit;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> bound_limit;
  shared_ptr<duckdb::Binder,_true> new_binder;
  undefined1 local_1a0 [16];
  Binder *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  optional_ptr<duckdb::DummyBinding,_true> local_180;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_178;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_170;
  Binder *local_168;
  undefined4 local_15c;
  undefined1 local_158 [64];
  undefined1 local_118 [40];
  Value local_f0;
  LogicalType local_b0;
  ExpressionBinder local_98;
  
  local_15c = CONCAT31(in_register_00000089,is_offset);
  local_1a0._8_8_ = __return_storage_ptr__;
  CreateBinder((Binder *)local_118,this->context,(optional_ptr<duckdb::Binder,_true>)this,
               REGULAR_BINDER);
  pBVar5 = shared_ptr<duckdb::Binder,_true>::operator*
                     ((shared_ptr<duckdb::Binder,_true> *)local_118);
  ExpressionBinder::ExpressionBinder(&local_98,pBVar5,this->context,false);
  LogicalType::LogicalType((LogicalType *)local_158,is_percentage * '\t' + BIGINT);
  uVar2 = local_158._0_8_;
  local_98.target_type.id_ = local_158[0];
  local_98.target_type.physical_type_ = local_158[1];
  local_158._0_8_ = uVar2;
  LogicalType::~LogicalType((LogicalType *)local_158);
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(limit_val);
  (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_190,pPVar6);
  ExpressionBinder::Bind
            ((ExpressionBinder *)local_1a0,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_98,(optional_ptr<duckdb::LogicalType,_true>)limit_val,false);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)local_1a0);
  iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[4])(pEVar7);
  if ((char)iVar4 == '\0') {
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)local_1a0);
    iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar7);
    if ((char)iVar4 == '\0') {
      pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                         ((shared_ptr<duckdb::Binder,_true> *)local_118);
      if ((pBVar8->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pBVar8->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        local_158._0_8_ = local_158 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,"Correlated columns not supported in LIMIT/OFFSET","");
        BinderException::BinderException(pBVar9,(string *)local_158);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar5 = shared_ptr<duckdb::Binder,_true>::operator*
                         ((shared_ptr<duckdb::Binder,_true> *)local_118);
      MoveCorrelatedExpressions(this,pBVar5);
      __return_storage_ptr___00 = (BoundLimitNode *)local_1a0._8_8_;
      if (is_percentage) {
        local_180.ptr = (DummyBinding *)local_1a0._0_8_;
        local_1a0._0_8_ = (DummyBinding *)0x0;
        BoundLimitNode::ExpressionPercentage
                  ((BoundLimitNode *)local_1a0._8_8_,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_180);
        if (local_180.ptr != (DummyBinding *)0x0) {
          (*((local_180.ptr)->super_Binding)._vptr_Binding[1])();
        }
        local_180.ptr = (DummyBinding *)0x0;
      }
      else {
        local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._0_8_;
        local_1a0._0_8_ = (DummyBinding *)0x0;
        BoundLimitNode::ExpressionValue
                  ((BoundLimitNode *)local_1a0._8_8_,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_188);
        if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*(local_188._M_pi)->_vptr__Sp_counted_base[1])();
        }
        local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
    }
    else {
      pCVar1 = this->context;
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_1a0);
      ExpressionExecutor::EvaluateScalar((Value *)(local_118 + 0x28),pCVar1,expr_00,false);
      pCVar1 = this->context;
      LogicalType::LogicalType(&local_b0,is_percentage * '\t' + BIGINT);
      Value::CastAs((Value *)local_158,(Value *)(local_118 + 0x28),pCVar1,&local_b0,false);
      LogicalType::~LogicalType(&local_b0);
      Value::~Value((Value *)(local_118 + 0x28));
      __return_storage_ptr___00 = (BoundLimitNode *)local_1a0._8_8_;
      if (is_percentage) {
        if ((bool)local_158[0x18] == false) {
          local_118._16_8_ = Value::GetValue<double>((Value *)local_158);
        }
        else {
          local_118._16_8_ = (ClientContext *)0x4059000000000000;
        }
        bVar3 = Value::IsNan<double>((double)local_118._16_8_);
        if ((100.0 < (double)local_118._16_8_) || (bVar3 || (double)local_118._16_8_ < 0.0)) {
          this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_f0.type_._0_8_ =
               &local_f0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_118 + 0x28),
                     "Limit percent out of range, should be between 0% and 100%","");
          OutOfRangeException::OutOfRangeException(this_00,(string *)(local_118 + 0x28));
          __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        BoundLimitNode::ConstantPercentage(__return_storage_ptr___00,(double)local_118._16_8_);
      }
      else {
        if ((bool)local_158[0x18] == false) {
          value = Value::GetValue<long>((Value *)local_158);
        }
        else {
          value = 0x7fffffffffffffff;
          if ((char)local_15c != '\0') {
            value = 0;
          }
        }
        if (value < 0) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_1a0);
          error_location.index = (pEVar7->super_BaseExpression).query_location.index;
          local_f0.type_._0_8_ =
               &local_f0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_118 + 0x28),"LIMIT/OFFSET cannot be negative","");
          BinderException::BinderException<>(pBVar9,error_location,(string *)(local_118 + 0x28));
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        BoundLimitNode::ConstantValue(__return_storage_ptr___00,value);
      }
      Value::~Value((Value *)local_158);
    }
  }
  else {
    if ((order_binder->extra_list).ptr ==
        (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
         *)0x0) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      local_158._0_8_ = local_158 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"Subquery in LIMIT/OFFSET not supported in set operation","");
      BinderException::BinderException(pBVar9,(string *)local_158);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_168 = local_190;
    local_190 = (Binder *)0x0;
    OrderBinder::CreateExtraReference
              ((OrderBinder *)local_158,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)order_binder);
    if (local_168 != (Binder *)0x0) {
      (*(code *)(((local_168->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    __return_storage_ptr___00 = (BoundLimitNode *)local_1a0._8_8_;
    local_168 = (Binder *)0x0;
    if (is_percentage) {
      local_170._M_head_impl = (Expression *)local_158._0_8_;
      local_158._0_8_ = (ExpressionBinder *)0x0;
      BoundLimitNode::ExpressionPercentage
                ((BoundLimitNode *)local_1a0._8_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_170);
      if ((ExpressionBinder *)local_170._M_head_impl != (ExpressionBinder *)0x0) {
        (**(code **)&(((((_Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                          *)&((local_170._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
                       ->_M_impl).super__Vector_impl_data._M_start)->super_Binding).binding_type)();
      }
      local_170._M_head_impl = (Expression *)0x0;
    }
    else {
      local_178.ptr = (vector<duckdb::DummyBinding,_true> *)local_158._0_8_;
      local_158._0_8_ = (ExpressionBinder *)0x0;
      BoundLimitNode::ExpressionValue
                ((BoundLimitNode *)local_1a0._8_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_178);
      if (local_178.ptr != (vector<duckdb::DummyBinding,_true> *)0x0) {
        (**(code **)&((((local_178.ptr)->
                       super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                       super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Binding).binding_type)();
      }
      local_178.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
    }
    if ((ExpressionBinder *)local_158._0_8_ != (ExpressionBinder *)0x0) {
      (**(code **)(*(long *)local_158._0_8_ + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_1a0._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_1a0._0_8_ + 8))();
  }
  if (local_190 != (Binder *)0x0) {
    (*(code *)(((local_190->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  ExpressionBinder::~ExpressionBinder(&local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  return __return_storage_ptr___00;
}

Assistant:

BoundLimitNode Binder::BindLimitValue(OrderBinder &order_binder, unique_ptr<ParsedExpression> limit_val,
                                      bool is_percentage, bool is_offset) {
	auto new_binder = Binder::CreateBinder(context, this);
	ExpressionBinder expr_binder(*new_binder, context);
	auto target_type = is_percentage ? LogicalType::DOUBLE : LogicalType::BIGINT;
	expr_binder.target_type = target_type;
	auto original_limit = limit_val->Copy();
	auto expr = expr_binder.Bind(limit_val);
	if (expr->HasSubquery()) {
		if (!order_binder.HasExtraList()) {
			throw BinderException("Subquery in LIMIT/OFFSET not supported in set operation");
		}
		auto bound_limit = order_binder.CreateExtraReference(std::move(original_limit));
		if (is_percentage) {
			return BoundLimitNode::ExpressionPercentage(std::move(bound_limit));
		} else {
			return BoundLimitNode::ExpressionValue(std::move(bound_limit));
		}
	}
	if (expr->IsFoldable()) {
		//! this is a constant
		auto val = ExpressionExecutor::EvaluateScalar(context, *expr).CastAs(context, target_type);
		if (is_percentage) {
			D_ASSERT(!is_offset);
			double percentage_val;
			if (val.IsNull()) {
				percentage_val = 100.0;
			} else {
				percentage_val = val.GetValue<double>();
			}
			if (Value::IsNan(percentage_val) || percentage_val < 0 || percentage_val > 100) {
				throw OutOfRangeException("Limit percent out of range, should be between 0% and 100%");
			}
			return BoundLimitNode::ConstantPercentage(percentage_val);
		} else {
			int64_t constant_val;
			if (val.IsNull()) {
				constant_val = is_offset ? 0 : NumericLimits<int64_t>::Maximum();
			} else {
				constant_val = val.GetValue<int64_t>();
			}
			if (constant_val < 0) {
				throw BinderException(expr->GetQueryLocation(), "LIMIT/OFFSET cannot be negative");
			}
			return BoundLimitNode::ConstantValue(constant_val);
		}
	}
	if (!new_binder->correlated_columns.empty()) {
		throw BinderException("Correlated columns not supported in LIMIT/OFFSET");
	}
	// move any correlated columns to this binder
	MoveCorrelatedExpressions(*new_binder);
	if (is_percentage) {
		return BoundLimitNode::ExpressionPercentage(std::move(expr));
	} else {
		return BoundLimitNode::ExpressionValue(std::move(expr));
	}
}